

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O2

shared_ptr<MyCompiler::VarDeclaration> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::VarDeclaration>(RecursiveDescentParser *this)

{
  istream *piVar1;
  int iVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::VarDeclaration> sVar3;
  allocator local_51;
  string local_50;
  
  sVar3 = std::make_shared<MyCompiler::VarDeclaration>();
  accept(in_RSI,0x1d,
         (sockaddr *)
         sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._M_pi,in_RCX);
  do {
    piVar1 = this->stream;
    parse<MyCompiler::Ident>((RecursiveDescentParser *)&local_50);
    std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
              ((vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_> *)(piVar1 + 0x48),
               (value_type *)local_50._M_dataplus._M_p);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    iVar2 = accept(in_RSI,0xf,__addr,in_RCX);
  } while ((char)iVar2 != '\0');
  std::__cxx11::string::string((string *)&local_50,"semicolon or comma expected",&local_51);
  except(in_RSI,SEMICOLON,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::VarDeclaration>)
         sVar3.super___shared_ptr<MyCompiler::VarDeclaration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::VarDeclaration> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<VarDeclaration>();

    accept(SymbolType::VAR);
    do
        pResult->vIdent.push_back(*parse<Ident>());
    while (accept(SymbolType::COMMA));
    except(SymbolType::SEMICOLON, "semicolon or comma expected");

    return pResult;
}